

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spin_mutex.h
# Opt level: O0

void __thiscall spin_mutex_t::lock(spin_mutex_t *this)

{
  __atomic_flag_data_type _Var1;
  spin_mutex_t *this_local;
  
  do {
    LOCK();
    _Var1 = (this->lock_).super___atomic_flag_base._M_i;
    (this->lock_).super___atomic_flag_base._M_i = true;
    UNLOCK();
  } while (_Var1 != false);
  return;
}

Assistant:

void lock() noexcept {
    while (lock_.test_and_set(std::memory_order_acquire));  // acquire lock
  }